

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O1

size_t fs_root_name(char *path,char *result,size_t buffer_size)

{
  size_type sVar1;
  string_view s;
  undefined1 in_stack_00000008 [16];
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  strlen(path);
  fs_root_name_abi_cxx11_((string_view)in_stack_00000008);
  s._M_str = (char *)local_40;
  s._M_len = local_38;
  sVar1 = fs_str2char(s,result,buffer_size);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return sVar1;
}

Assistant:

size_t fs_root_name(const char* path, char* result, const size_t buffer_size)
{
  return fs_str2char(fs_root_name(path), result, buffer_size);
}